

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

DivideBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_dividebroadcastable(NeuralNetworkLayer *this)

{
  DivideBroadcastableLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x37a) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x37a;
    this_00 = (DivideBroadcastableLayerParams *)operator_new(0x18);
    DivideBroadcastableLayerParams::DivideBroadcastableLayerParams(this_00);
    (this->layer_).dividebroadcastable_ = this_00;
  }
  return (DivideBroadcastableLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::DivideBroadcastableLayerParams* NeuralNetworkLayer::mutable_dividebroadcastable() {
  if (!has_dividebroadcastable()) {
    clear_layer();
    set_has_dividebroadcastable();
    layer_.dividebroadcastable_ = new ::CoreML::Specification::DivideBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.divideBroadcastable)
  return layer_.dividebroadcastable_;
}